

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

map map_create(map_cb_hash hash_cb,map_cb_compare compare_cb)

{
  size_t sVar1;
  bucket pbVar2;
  map_cb_compare in_RSI;
  map_cb_hash in_RDI;
  map m;
  map local_8;
  
  if ((in_RDI == (map_cb_hash)0x0) || (in_RSI == (map_cb_compare)0x0)) {
    log_write_impl_va("metacall",0x44,"map_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,LOG_LEVEL_ERROR,"Invalid map creation parameters");
    local_8 = (map)0x0;
  }
  else {
    local_8 = (map)malloc(0x30);
    if (local_8 == (map)0x0) {
      log_write_impl_va("metacall",0x4c,"map_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,LOG_LEVEL_ERROR,"Bad map allocation");
      local_8 = (map)0x0;
    }
    else {
      local_8->hash_cb = in_RDI;
      local_8->compare_cb = in_RSI;
      local_8->count = 0;
      local_8->prime = 0;
      sVar1 = bucket_capacity(local_8->prime);
      local_8->capacity = sVar1;
      pbVar2 = bucket_create((size_t)in_RSI);
      local_8->buckets = pbVar2;
      if (local_8->buckets == (bucket)0x0) {
        log_write_impl_va("metacall",0x59,"map_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                          ,LOG_LEVEL_ERROR,"Bad map bucket creation");
        free(local_8);
        local_8 = (map)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

map map_create(map_cb_hash hash_cb, map_cb_compare compare_cb)
{
	map m;

	if (hash_cb == NULL || compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map creation parameters");
		return NULL;
	}

	m = malloc(sizeof(struct map_type));

	if (m == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map allocation");
		return NULL;
	}

	m->hash_cb = hash_cb;
	m->compare_cb = compare_cb;
	m->count = 0;
	m->prime = 0;
	m->capacity = bucket_capacity(m->prime);
	m->buckets = bucket_create(m->capacity);

	if (m->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map bucket creation");
		free(m);
		return NULL;
	}

	return m;
}